

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

void initTable(vm *v)

{
  module *pmVar1;
  element_pointer paVar2;
  table *t;
  function_index *pfVar3;
  uint64 uVar4;
  uint local_3c;
  int j;
  uint64 offset;
  element_pointer ep;
  int i;
  module *module;
  table *table;
  vm *v_local;
  
  if ((v->m->table_sec).table_segment_count != 0) {
    t = &v->table;
    pmVar1 = v->m;
    t->table_type = (pmVar1->table_sec).table_segment_addr;
    if ((t->table_type->limit).tag == '\0') {
      (v->table).itemCount = (t->table_type->limit).min;
    }
    else {
      (v->table).itemCount = (t->table_type->limit).max;
    }
    pfVar3 = (function_index *)malloc((ulong)(v->table).itemCount << 2);
    (v->table).item = pfVar3;
    for (ep._4_4_ = 0; ep._4_4_ < (pmVar1->element_sec).element_segment_count;
        ep._4_4_ = ep._4_4_ + 1) {
      paVar2 = (pmVar1->element_sec).element_segment_addr;
      execInst(v,&paVar2[(int)ep._4_4_].offset);
      uVar4 = popU64(&v->operandStack);
      for (local_3c = 0; local_3c < paVar2[(int)ep._4_4_].init_data_count; local_3c = local_3c + 1)
      {
        setTable(t,(int)uVar4 + local_3c,paVar2[(int)ep._4_4_].init_data[(int)local_3c]);
      }
    }
  }
  return;
}

Assistant:

void initTable(vm *v) {
    if (v->m->table_sec.table_segment_count > 0) {
        table *table = &v->table;
        module *module = v->m;
        table->table_type = module->table_sec.table_segment_addr;
        if (table->table_type->limit.tag == only_min) {
            table->itemCount = table->table_type->limit.min;
        } else {
            table->itemCount = table->table_type->limit.max;
        }
        table->item = malloc(table->itemCount * sizeof(func_index));
        /*写入元素段的内容*/
        for (int i = 0; i < module->element_sec.element_segment_count; ++i) {
            element_pointer ep = module->element_sec.element_segment_addr + i;
            execInst(v, &ep->offset);
            uint64 offset = popU64(&v->operandStack);
            for (int j = 0; j < ep->init_data_count; ++j) {
                setTable(table, offset + j, *(ep->init_data + j));
            }
        }
    }
}